

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

int Curl_cpool_check_limits(Curl_easy *data,connectdata *conn)

{
  Curl_multi *pCVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  cpool *cpool;
  cpool_bundle *list;
  size_t sVar4;
  Curl_llist_node *n;
  connectdata *pcVar5;
  timediff_t tVar6;
  connectdata *pcVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  curltime cVar12;
  curltime newer;
  curltime older;
  
  cpool = cpool_get_instance(data);
  if (cpool == (cpool *)0x0) {
    return 0;
  }
  if ((data == (Curl_easy *)0x0) || (pCVar1 = data->multi, pCVar1 == (Curl_multi *)0x0)) {
    uVar8 = 0;
    uVar9 = 0;
  }
  else {
    uVar8 = pCVar1->max_host_connections;
    uVar9 = pCVar1->max_total_connections;
  }
  if (uVar8 == 0 && uVar9 == 0) {
    return 0;
  }
  if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
    Curl_share_lock(cpool->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
  }
  cpool->field_0x98 = cpool->field_0x98 | 1;
  if (uVar8 != 0) {
    while (list = cpool_find_bundle(cpool,conn), list != (cpool_bundle *)0x0) {
      sVar4 = Curl_llist_count(&list->conns);
      if (sVar4 < uVar8) {
LAB_001189a6:
        sVar4 = Curl_llist_count(&list->conns);
        if (uVar8 > sVar4 && uVar9 != 0) goto LAB_001189c6;
        uVar10 = (uint)(uVar8 <= sVar4);
        goto LAB_00118a01;
      }
      cVar12 = Curl_now();
      n = Curl_llist_head(&list->conns);
      pcVar7 = (connectdata *)0x0;
      lVar11 = -1;
      for (; n != (Curl_llist_node *)0x0; n = Curl_node_next(n)) {
        pcVar5 = (connectdata *)Curl_node_elem(n);
        sVar4 = Curl_llist_count(&pcVar5->easyq);
        if ((sVar4 == 0) &&
           (uVar2 = (pcVar5->lastused).tv_sec, uVar3 = (pcVar5->lastused).tv_usec,
           older.tv_usec = uVar3, older.tv_sec = uVar2, newer._12_4_ = 0,
           newer.tv_sec = SUB128(cVar12._0_12_,0), newer.tv_usec = SUB124(cVar12._0_12_,8),
           older._12_4_ = 0, tVar6 = Curl_timediff(newer,older), lVar11 < tVar6)) {
          lVar11 = tVar6;
          pcVar7 = pcVar5;
        }
      }
      if (pcVar7 == (connectdata *)0x0) goto LAB_001189a6;
      Curl_cpool_disconnect(data,pcVar7,false);
    }
  }
  if (uVar9 != 0) {
LAB_001189c6:
    do {
      uVar8 = cpool->num_conn;
      if (uVar8 < uVar9) goto LAB_001189ef;
      pcVar7 = cpool_get_oldest_idle(cpool);
      if (pcVar7 == (connectdata *)0x0) {
        uVar8 = cpool->num_conn;
        goto LAB_001189ef;
      }
      Curl_cpool_disconnect(data,pcVar7,false);
    } while( true );
  }
  uVar10 = 0;
LAB_00118a01:
  cpool->field_0x98 = cpool->field_0x98 & 0xfe;
  if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
    Curl_share_unlock(cpool->idata,CURL_LOCK_DATA_CONNECT);
  }
  return uVar10;
LAB_001189ef:
  uVar10 = (uint)(uVar9 <= uVar8) * 2;
  goto LAB_00118a01;
}

Assistant:

int Curl_cpool_check_limits(struct Curl_easy *data,
                            struct connectdata *conn)
{
  struct cpool *cpool = cpool_get_instance(data);
  struct cpool_bundle *bundle;
  size_t dest_limit = 0;
  size_t total_limit = 0;
  int result = CPOOL_LIMIT_OK;

  if(!cpool)
    return CPOOL_LIMIT_OK;

  if(data && data->multi) {
    dest_limit = data->multi->max_host_connections;
    total_limit = data->multi->max_total_connections;
  }

  if(!dest_limit && !total_limit)
    return CPOOL_LIMIT_OK;

  CPOOL_LOCK(cpool);
  if(dest_limit) {
    bundle = cpool_find_bundle(cpool, conn);
    while(bundle && (Curl_llist_count(&bundle->conns) >= dest_limit)) {
      struct connectdata *oldest_idle = NULL;
      /* The bundle is full. Extract the oldest connection that may
       * be removed now, if there is one. */
      oldest_idle = cpool_bundle_get_oldest_idle(bundle);
      if(!oldest_idle)
        break;
      /* disconnect the old conn and continue */
      DEBUGF(infof(data, "Discarding connection #%"
                   FMT_OFF_T " from %zu to reach destination "
                   "limit of %zu", oldest_idle->connection_id,
                   Curl_llist_count(&bundle->conns), dest_limit));
      Curl_cpool_disconnect(data, oldest_idle, FALSE);

      /* in case the bundle was destroyed in disconnect, look it up again */
      bundle = cpool_find_bundle(cpool, conn);
    }
    if(bundle && (Curl_llist_count(&bundle->conns) >= dest_limit)) {
      result = CPOOL_LIMIT_DEST;
      goto out;
    }
  }

  if(total_limit) {
    while(cpool->num_conn >= total_limit) {
      struct connectdata *oldest_idle = cpool_get_oldest_idle(cpool);
      if(!oldest_idle)
        break;
      /* disconnect the old conn and continue */
      DEBUGF(infof(data, "Discarding connection #%"
                   FMT_OFF_T " from %zu to reach total "
                   "limit of %zu",
                   oldest_idle->connection_id, cpool->num_conn, total_limit));
      Curl_cpool_disconnect(data, oldest_idle, FALSE);
    }
    if(cpool->num_conn >= total_limit) {
      result = CPOOL_LIMIT_TOTAL;
      goto out;
    }
  }

out:
  CPOOL_UNLOCK(cpool);
  return result;
}